

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_tree.h
# Opt level: O3

size_t dicroce::blob_tree::_read_treeb(uint8_t *p,uint8_t *end,blob_tree *rt)

{
  uchar *puVar1;
  uint uVar2;
  size_t sVar3;
  mapped_type *this;
  runtime_error *this_00;
  ushort *puVar4;
  ushort *p_00;
  ulong uVar5;
  uint8_t *p_01;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  string name;
  blob_tree childObj;
  key_type local_a8;
  blob_tree local_88;
  
  if ((ulong)((long)end - (long)p) < 5) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Buffer too small to deserialize blob_tree.");
  }
  else {
    if (*p < 2) {
      p_00 = (ushort *)(p + 5);
      uVar2 = *(uint *)(p + 1);
      uVar6 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (*p == 0) {
        if (uVar2 != 0) {
          uVar8 = (ulong)(uVar6 + (uVar6 == 0));
          do {
            if ((ulong)((long)end - (long)p_00) < 2) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Buffer too small to deserialize blob_tree.");
              goto LAB_00104a0d;
            }
            puVar4 = p_00 + 1;
            uVar5 = (ulong)(ushort)(*p_00 << 8 | *p_00 >> 8);
            if ((ulong)((long)end - (long)puVar4) < uVar5) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Buffer too small to deserialize blob_tree.");
              goto LAB_00104a0d;
            }
            p_01 = (uint8_t *)(uVar5 + (long)puVar4);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,puVar4,p_01);
            local_88._children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_88._children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            local_88._children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_88._children._M_t._M_impl.super__Rb_tree_header._M_header;
            local_88._payload.first = 0;
            local_88._payload.second = (uchar *)0x0;
            local_88._childrenByIndex.
            super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_88._childrenByIndex.
            super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_88._children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_88._childrenByIndex.
            super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_88._children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_88._children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            sVar3 = _read_treeb(p_01,end,&local_88);
            this = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
                   ::operator[](&rt->_children,&local_a8);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
            ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
                         *)this,(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
                                 *)&local_88);
            std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>::operator=
                      (&this->_childrenByIndex,&local_88._childrenByIndex);
            (this->_payload).first = local_88._payload.first;
            (this->_payload).second = local_88._payload.second;
            std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>::~vector
                      (&local_88._childrenByIndex);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
                         *)&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            p_00 = (ushort *)(p_01 + sVar3);
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
      }
      else {
        uVar8 = (ulong)uVar6;
        std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>::resize
                  (&rt->_childrenByIndex,uVar8);
        if (uVar2 != 0) {
          lVar7 = 0;
          do {
            sVar3 = _read_treeb((uint8_t *)p_00,end,
                                (blob_tree *)
                                ((long)&(((rt->_childrenByIndex).
                                          super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_children).
                                        _M_t._M_impl + lVar7));
            p_00 = (ushort *)((long)p_00 + sVar3);
            lVar7 = lVar7 + 0x58;
          } while ((uVar8 + (uVar8 == 0)) * 0x58 - lVar7 != 0);
        }
      }
LAB_0010495f:
      return (long)p_00 - (long)p;
    }
    if ((ulong)((long)end - (long)(p + 1)) < 4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Buffer too small to deserialize blob_tree.");
    }
    else {
      uVar2 = *(uint *)(p + 1);
      puVar1 = p + 5;
      uVar8 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                     uVar2 << 0x18);
      if (uVar8 <= (ulong)((long)end - (long)puVar1)) {
        (rt->_payload).first = uVar8;
        (rt->_payload).second = puVar1;
        p_00 = (ushort *)(puVar1 + uVar8);
        goto LAB_0010495f;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Buffer too small to deserialize blob_tree.");
    }
  }
LAB_00104a0d:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static size_t _read_treeb(const uint8_t* p, const uint8_t* end, blob_tree& rt)
    {
        if(_bytes_left(p, end) < 5)
            throw std::runtime_error("Buffer too small to deserialize blob_tree.");

        const uint8_t* fp = p;
        uint8_t type = *p;
        ++p;

        if(type == NT_OBJECT || type == NT_ARRAY)
        {
            uint32_t word = *(uint32_t*)p;
            p+=sizeof(uint32_t);
            uint32_t numChildren = ntohl(word);

            if(type == NT_OBJECT)
            {
                for(size_t i = 0; i < numChildren; ++i)
                {
                    if(_bytes_left(p, end) < sizeof(uint16_t))
                        throw std::runtime_error("Buffer too small to deserialize blob_tree.");

                    uint16_t shortVal = *(uint16_t*)p;
                    p+=sizeof(uint16_t);
                    uint16_t nameLen = ntohs(shortVal);

                    if(_bytes_left(p, end) < nameLen)
                        throw std::runtime_error("Buffer too small to deserialize blob_tree.");

                    std::string name((char*)p, nameLen);
                    p+=nameLen;
                    blob_tree childObj;
                    p+=_read_treeb(p, end, childObj);
                    rt._children[name] = childObj;
                }
            }
            else
            {
                rt._childrenByIndex.resize(numChildren);
                for(size_t i = 0; i < numChildren; ++i)
                    p+=_read_treeb(p, end, rt._childrenByIndex[i]);
            }
        }
        else
        {
            if(_bytes_left(p, end) < sizeof(uint32_t))
                throw std::runtime_error("Buffer too small to deserialize blob_tree.");

            uint32_t word = *(uint32_t*)p;
            p+=sizeof(uint32_t);
            uint32_t payloadSize = ntohl(word);

            if(_bytes_left(p, end) < payloadSize)
                throw std::runtime_error("Buffer too small to deserialize blob_tree.");

            rt._payload = std::make_pair((size_t)payloadSize, p);
            p+=payloadSize;
        }

        return p - fp;
    }